

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayColorDepthAttachmentsTest::TextureCubeMapArrayColorDepthAttachmentsTest
          (TextureCubeMapArrayColorDepthAttachmentsTest *this,Context *context,
          ExtParameters *extParams,char *name,char *description)

{
  _texture_size local_64;
  _texture_size local_5c;
  _texture_size local_54;
  _texture_size local_4c [2];
  _texture_size local_38;
  char *local_30;
  char *description_local;
  char *name_local;
  ExtParameters *extParams_local;
  Context *context_local;
  TextureCubeMapArrayColorDepthAttachmentsTest *this_local;
  
  local_30 = description;
  description_local = name;
  name_local = (char *)extParams;
  extParams_local = (ExtParameters *)context;
  context_local = (Context *)this;
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureCubeMapArrayColorDepthAttachmentsTest_032734e0;
  this->m_vao_id = 0;
  this->m_color_texture_id = 0;
  this->m_depth_texture_id = 0;
  this->m_fragment_shader_id = 0;
  this->m_framebuffer_object_id = 0;
  this->m_layered_geometry_shader_id = 0;
  this->m_layered_program_id = 0;
  this->m_non_layered_geometry_shader_id = 0;
  this->m_non_layered_program_id = 0;
  this->m_non_layered_program_id_uni_layer_uniform_location = 0;
  this->m_vertex_shader_id = 0;
  std::
  vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>
  ::vector(&this->m_resolutions);
  this->m_depth_internal_format = 0;
  this->m_depth_type = 0;
  this->m_n_invalid_color_checks = 0;
  this->m_n_invalid_depth_checks = 0;
  _texture_size::_texture_size(&local_38,8,8);
  std::
  vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>
  ::push_back(&this->m_resolutions,&local_38);
  _texture_size::_texture_size(local_4c,0x40,3);
  std::
  vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>
  ::push_back(&this->m_resolutions,local_4c);
  _texture_size::_texture_size(&local_54,0x75,1);
  std::
  vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>
  ::push_back(&this->m_resolutions,&local_54);
  _texture_size::_texture_size(&local_5c,0x100,1);
  std::
  vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>
  ::push_back(&this->m_resolutions,&local_5c);
  _texture_size::_texture_size(&local_64,0xad,3);
  std::
  vector<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>
  ::push_back(&this->m_resolutions,&local_64);
  return;
}

Assistant:

TextureCubeMapArrayColorDepthAttachmentsTest::TextureCubeMapArrayColorDepthAttachmentsTest(
	Context& context, const ExtParameters& extParams, const char* name, const char* description)
	: TestCaseBase(context, extParams, name, description)
	, m_vao_id(0)
	, m_color_texture_id(0)
	, m_depth_texture_id(0)
	, m_fragment_shader_id(0)
	, m_framebuffer_object_id(0)
	, m_layered_geometry_shader_id(0)
	, m_layered_program_id(0)
	, m_non_layered_geometry_shader_id(0)
	, m_non_layered_program_id(0)
	, m_non_layered_program_id_uni_layer_uniform_location(0)
	, m_vertex_shader_id(0)
	, m_depth_internal_format(0)
	, m_depth_type(0)
	, m_n_invalid_color_checks(0)
	, m_n_invalid_depth_checks(0)
{
	/* Define tested resolutions */
	m_resolutions.push_back(_texture_size(8, 8));
	m_resolutions.push_back(_texture_size(64, 3));
	m_resolutions.push_back(_texture_size(117, 1));
	m_resolutions.push_back(_texture_size(256, 1));
	m_resolutions.push_back(_texture_size(173, 3));
}